

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int agginfoPersistExprCb(Walker *pWalker,Expr *pExpr)

{
  short sVar1;
  AggInfo *pAVar2;
  Parse *pParse;
  sqlite3 *db;
  Expr *pExpr_00;
  AggInfo *pAggInfo;
  
  if (((pExpr->flags & 0x14000) == 0) && (pAVar2 = pExpr->pAggInfo, pAVar2 != (AggInfo *)0x0)) {
    sVar1 = pExpr->iAgg;
    pParse = pWalker->pParse;
    db = pParse->db;
    if (pExpr->op == 0xa9) {
      if (pAVar2->aCol[sVar1].pCExpr != pExpr) {
        return 0;
      }
      pExpr_00 = sqlite3ExprDup(db,pExpr,0);
      if (pExpr_00 == (Expr *)0x0) {
        return 0;
      }
      pAVar2->aCol[sVar1].pCExpr = pExpr_00;
    }
    else {
      if (pAVar2->aFunc[sVar1].pFExpr != pExpr) {
        return 0;
      }
      pExpr_00 = sqlite3ExprDup(db,pExpr,0);
      if (pExpr_00 == (Expr *)0x0) {
        return 0;
      }
      pAVar2->aFunc[sVar1].pFExpr = pExpr_00;
    }
    sqlite3ExprDeferredDelete(pParse,pExpr_00);
  }
  return 0;
}

Assistant:

static int agginfoPersistExprCb(Walker *pWalker, Expr *pExpr){
  if( ALWAYS(!ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced))
   && pExpr->pAggInfo!=0
  ){
    AggInfo *pAggInfo = pExpr->pAggInfo;
    int iAgg = pExpr->iAgg;
    Parse *pParse = pWalker->pParse;
    sqlite3 *db = pParse->db;
    assert( pExpr->op==TK_AGG_COLUMN || pExpr->op==TK_AGG_FUNCTION );
    if( pExpr->op==TK_AGG_COLUMN ){
      assert( iAgg>=0 && iAgg<pAggInfo->nColumn );
      if( pAggInfo->aCol[iAgg].pCExpr==pExpr ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr ){
          pAggInfo->aCol[iAgg].pCExpr = pExpr;
          sqlite3ExprDeferredDelete(pParse, pExpr);
        }
      }
    }else{
      assert( iAgg>=0 && iAgg<pAggInfo->nFunc );
      if( pAggInfo->aFunc[iAgg].pFExpr==pExpr ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr ){
          pAggInfo->aFunc[iAgg].pFExpr = pExpr;
          sqlite3ExprDeferredDelete(pParse, pExpr);
        }
      }
    }
  }
  return WRC_Continue;
}